

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int walHashGet(Wal *pWal,int iHash,WalHashLoc *pLoc)

{
  u32 **ppPage;
  u32 *puVar1;
  int iVar2;
  
  ppPage = &pLoc->aPgno;
  if (iHash < pWal->nWiData) {
    puVar1 = pWal->apWiData[iHash];
    *ppPage = puVar1;
    iVar2 = 0;
    if (puVar1 != (u32 *)0x0) goto LAB_001372c9;
  }
  iVar2 = walIndexPageRealloc(pWal,iHash,ppPage);
LAB_001372c9:
  puVar1 = *ppPage;
  if (puVar1 == (u32 *)0x0) {
    iVar2 = iVar2 + (uint)(iVar2 == 0);
  }
  else {
    pLoc->aHash = (ht_slot *)(puVar1 + 0x1000);
    if (iHash == 0) {
      pLoc->aPgno = puVar1 + 0x22;
      pLoc->iZero = 0;
    }
    else {
      pLoc->iZero = iHash * 0x1000 - 0x22;
    }
  }
  return iVar2;
}

Assistant:

static int walHashGet(
  Wal *pWal,                      /* WAL handle */
  int iHash,                      /* Find the iHash'th table */
  WalHashLoc *pLoc                /* OUT: Hash table location */
){
  int rc;                         /* Return code */

  rc = walIndexPage(pWal, iHash, &pLoc->aPgno);
  assert( rc==SQLITE_OK || iHash>0 );

  if( pLoc->aPgno ){
    pLoc->aHash = (volatile ht_slot *)&pLoc->aPgno[HASHTABLE_NPAGE];
    if( iHash==0 ){
      pLoc->aPgno = &pLoc->aPgno[WALINDEX_HDR_SIZE/sizeof(u32)];
      pLoc->iZero = 0;
    }else{
      pLoc->iZero = HASHTABLE_NPAGE_ONE + (iHash-1)*HASHTABLE_NPAGE;
    }
  }else if( NEVER(rc==SQLITE_OK) ){
    rc = SQLITE_ERROR;
  }
  return rc;
}